

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

UBool __thiscall icu_63::DateFormat::isLenient(DateFormat *this)

{
  int iVar1;
  bool local_21;
  undefined4 local_18;
  char local_11;
  UErrorCode status;
  UBool lenient;
  DateFormat *this_local;
  
  local_11 = '\x01';
  _status = this;
  if (this->fCalendar != (Calendar *)0x0) {
    local_11 = Calendar::isLenient(this->fCalendar);
  }
  local_18 = 0;
  local_21 = false;
  if (local_11 != '\0') {
    iVar1 = (*(this->super_Format).super_UObject._vptr_UObject[0x1c])(this,0,&local_18);
    local_21 = false;
    if ((char)iVar1 != '\0') {
      iVar1 = (*(this->super_Format).super_UObject._vptr_UObject[0x1c])(this,1,&local_18);
      local_21 = (char)iVar1 != '\0';
    }
  }
  return local_21;
}

Assistant:

UBool
DateFormat::isLenient() const
{
    UBool lenient = TRUE;
    if (fCalendar != NULL) {
        lenient = fCalendar->isLenient();
    }
    UErrorCode status = U_ZERO_ERROR;
    return lenient
        && getBooleanAttribute(UDAT_PARSE_ALLOW_WHITESPACE, status)
        && getBooleanAttribute(UDAT_PARSE_ALLOW_NUMERIC, status);
}